

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANTLRException.cpp
# Opt level: O2

void __thiscall ANTLRException::ANTLRException(ANTLRException *this,string *s)

{
  *(undefined ***)this = &PTR__ANTLRException_00213680;
  std::__cxx11::string::string((string *)&this->text,(string *)s);
  return;
}

Assistant:

ANTLRException::ANTLRException(const std::string& s)
: text(s)
{}